

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O2

void Seg_ManStop(Seg_Man_t *p)

{
  sat_solver_delete(p->pSat);
  Vec_IntFree(p->vEdges);
  Vec_IntFree(p->vFirsts);
  Vec_IntFree(p->vNvars);
  Vec_IntFree(p->vLits);
  Vec_IntFree(p->vPolars);
  Vec_IntFree(p->vToSkip);
  free(p->pLevels);
  free(p);
  return;
}

Assistant:

void Seg_ManStop( Seg_Man_t * p )
{
    sat_solver_delete( p->pSat );
    //Vec_IntFree( p->vCardVars );
    // internal
    Vec_IntFree( p->vEdges );
    Vec_IntFree( p->vFirsts );
    Vec_IntFree( p->vNvars );
    Vec_IntFree( p->vLits );
    Vec_IntFree( p->vPolars );
    Vec_IntFree( p->vToSkip );
    ABC_FREE( p->pLevels );
    // other
    ABC_FREE( p );
}